

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_8_3_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  v128 row1_1;
  v128 row0_1;
  int i_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  int local_6f4;
  int local_684;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  short local_388;
  short sStack_386;
  short sStack_384;
  short sStack_382;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  int dir_local;
  int sec_strength_local;
  int pri_strength_local;
  uint16_t *in_local;
  int dstride_local;
  void *dest_local;
  v128 res_128;
  v128 row1;
  v128 row0;
  int i;
  uint16_t *dst16;
  uint8_t *dst8;
  
  if (block_width == 8) {
    for (local_6f4 = 0; local_6f4 < block_height; local_6f4 = local_6f4 + 2) {
      uVar1 = *(undefined8 *)(in + local_6f4 * 0x90);
      uVar2 = *(undefined8 *)(in + local_6f4 * 0x90 + 4);
      uVar3 = *(undefined8 *)(in + (local_6f4 + 1) * 0x90);
      uVar4 = *(undefined8 *)(in + (local_6f4 + 1) * 0x90 + 4);
      local_398 = (short)uVar1;
      sStack_396 = (short)((ulong)uVar1 >> 0x10);
      sStack_394 = (short)((ulong)uVar1 >> 0x20);
      sStack_392 = (short)((ulong)uVar1 >> 0x30);
      sStack_390 = (short)uVar2;
      sStack_38e = (short)((ulong)uVar2 >> 0x10);
      sStack_38c = (short)((ulong)uVar2 >> 0x20);
      sStack_38a = (short)((ulong)uVar2 >> 0x30);
      local_3a8 = (short)uVar3;
      sStack_3a6 = (short)((ulong)uVar3 >> 0x10);
      sStack_3a4 = (short)((ulong)uVar3 >> 0x20);
      sStack_3a2 = (short)((ulong)uVar3 >> 0x30);
      sStack_3a0 = (short)uVar4;
      sStack_39e = (short)((ulong)uVar4 >> 0x10);
      sStack_39c = (short)((ulong)uVar4 >> 0x20);
      sStack_39a = (short)((ulong)uVar4 >> 0x30);
      *(ulong *)((long)dest + (long)(local_6f4 * dstride)) =
           CONCAT17((0 < sStack_38a) * (sStack_38a < 0x100) * (char)((ulong)uVar2 >> 0x30) -
                    (0xff < sStack_38a),
                    CONCAT16((0 < sStack_38c) * (sStack_38c < 0x100) * (char)((ulong)uVar2 >> 0x20)
                             - (0xff < sStack_38c),
                             CONCAT15((0 < sStack_38e) * (sStack_38e < 0x100) *
                                      (char)((ulong)uVar2 >> 0x10) - (0xff < sStack_38e),
                                      CONCAT14((0 < sStack_390) * (sStack_390 < 0x100) * (char)uVar2
                                               - (0xff < sStack_390),
                                               CONCAT13((0 < sStack_392) * (sStack_392 < 0x100) *
                                                        (char)((ulong)uVar1 >> 0x30) -
                                                        (0xff < sStack_392),
                                                        CONCAT12((0 < sStack_394) *
                                                                 (sStack_394 < 0x100) *
                                                                 (char)((ulong)uVar1 >> 0x20) -
                                                                 (0xff < sStack_394),
                                                                 CONCAT11((0 < sStack_396) *
                                                                          (sStack_396 < 0x100) *
                                                                          (char)((ulong)uVar1 >>
                                                                                0x10) -
                                                                          (0xff < sStack_396),
                                                                          (0 < local_398) *
                                                                          (local_398 < 0x100) *
                                                                          (char)uVar1 -
                                                                          (0xff < local_398))))))));
      *(ulong *)((long)dest + (long)((local_6f4 + 1) * dstride)) =
           CONCAT17((0 < sStack_39a) * (sStack_39a < 0x100) * (char)((ulong)uVar4 >> 0x30) -
                    (0xff < sStack_39a),
                    CONCAT16((0 < sStack_39c) * (sStack_39c < 0x100) * (char)((ulong)uVar4 >> 0x20)
                             - (0xff < sStack_39c),
                             CONCAT15((0 < sStack_39e) * (sStack_39e < 0x100) *
                                      (char)((ulong)uVar4 >> 0x10) - (0xff < sStack_39e),
                                      CONCAT14((0 < sStack_3a0) * (sStack_3a0 < 0x100) * (char)uVar4
                                               - (0xff < sStack_3a0),
                                               CONCAT13((0 < sStack_3a2) * (sStack_3a2 < 0x100) *
                                                        (char)((ulong)uVar3 >> 0x30) -
                                                        (0xff < sStack_3a2),
                                                        CONCAT12((0 < sStack_3a4) *
                                                                 (sStack_3a4 < 0x100) *
                                                                 (char)((ulong)uVar3 >> 0x20) -
                                                                 (0xff < sStack_3a4),
                                                                 CONCAT11((0 < sStack_3a6) *
                                                                          (sStack_3a6 < 0x100) *
                                                                          (char)((ulong)uVar3 >>
                                                                                0x10) -
                                                                          (0xff < sStack_3a6),
                                                                          (0 < local_3a8) *
                                                                          (local_3a8 < 0x100) *
                                                                          (char)uVar3 -
                                                                          (0xff < local_3a8))))))));
    }
  }
  else {
    for (local_684 = 0; local_684 < block_height; local_684 = local_684 + 4) {
      uVar1 = *(undefined8 *)(in + local_684 * 0x90);
      uVar2 = *(undefined8 *)(in + (local_684 * 0x90 + 0x90));
      uVar3 = *(undefined8 *)(in + (local_684 * 0x90 + 0x120));
      uVar4 = *(undefined8 *)(in + (local_684 * 0x90 + 0x1b0));
      local_378 = (short)uVar2;
      sStack_376 = (short)((ulong)uVar2 >> 0x10);
      sStack_374 = (short)((ulong)uVar2 >> 0x20);
      sStack_372 = (short)((ulong)uVar2 >> 0x30);
      sStack_370 = (short)uVar1;
      sStack_36e = (short)((ulong)uVar1 >> 0x10);
      sStack_36c = (short)((ulong)uVar1 >> 0x20);
      sStack_36a = (short)((ulong)uVar1 >> 0x30);
      local_388 = (short)uVar4;
      sStack_386 = (short)((ulong)uVar4 >> 0x10);
      sStack_384 = (short)((ulong)uVar4 >> 0x20);
      sStack_382 = (short)((ulong)uVar4 >> 0x30);
      sStack_380 = (short)uVar3;
      sStack_37e = (short)((ulong)uVar3 >> 0x10);
      sStack_37c = (short)((ulong)uVar3 >> 0x20);
      sStack_37a = (short)((ulong)uVar3 >> 0x30);
      *(uint *)((long)dest + (long)(local_684 * dstride)) =
           CONCAT13((0 < sStack_36a) * (sStack_36a < 0x100) * (char)((ulong)uVar1 >> 0x30) -
                    (0xff < sStack_36a),
                    CONCAT12((0 < sStack_36c) * (sStack_36c < 0x100) * (char)((ulong)uVar1 >> 0x20)
                             - (0xff < sStack_36c),
                             CONCAT11((0 < sStack_36e) * (sStack_36e < 0x100) *
                                      (char)((ulong)uVar1 >> 0x10) - (0xff < sStack_36e),
                                      (0 < sStack_370) * (sStack_370 < 0x100) * (char)uVar1 -
                                      (0xff < sStack_370))));
      *(uint *)((long)dest + (long)((local_684 + 1) * dstride)) =
           CONCAT13((0 < sStack_372) * (sStack_372 < 0x100) * (char)((ulong)uVar2 >> 0x30) -
                    (0xff < sStack_372),
                    CONCAT12((0 < sStack_374) * (sStack_374 < 0x100) * (char)((ulong)uVar2 >> 0x20)
                             - (0xff < sStack_374),
                             CONCAT11((0 < sStack_376) * (sStack_376 < 0x100) *
                                      (char)((ulong)uVar2 >> 0x10) - (0xff < sStack_376),
                                      (0 < local_378) * (local_378 < 0x100) * (char)uVar2 -
                                      (0xff < local_378))));
      *(uint *)((long)dest + (long)((local_684 + 2) * dstride)) =
           CONCAT13((0 < sStack_37a) * (sStack_37a < 0x100) * (char)((ulong)uVar3 >> 0x30) -
                    (0xff < sStack_37a),
                    CONCAT12((0 < sStack_37c) * (sStack_37c < 0x100) * (char)((ulong)uVar3 >> 0x20)
                             - (0xff < sStack_37c),
                             CONCAT11((0 < sStack_37e) * (sStack_37e < 0x100) *
                                      (char)((ulong)uVar3 >> 0x10) - (0xff < sStack_37e),
                                      (0 < sStack_380) * (sStack_380 < 0x100) * (char)uVar3 -
                                      (0xff < sStack_380))));
      *(uint *)((long)dest + (long)((local_684 + 3) * dstride)) =
           CONCAT13((0 < sStack_382) * (sStack_382 < 0x100) * (char)((ulong)uVar4 >> 0x30) -
                    (0xff < sStack_382),
                    CONCAT12((0 < sStack_384) * (sStack_384 < 0x100) * (char)((ulong)uVar4 >> 0x20)
                             - (0xff < sStack_384),
                             CONCAT11((0 < sStack_386) * (sStack_386 < 0x100) *
                                      (char)((ulong)uVar4 >> 0x10) - (0xff < sStack_386),
                                      (0 < local_388) * (local_388 < 0x100) * (char)uVar4 -
                                      (0xff < local_388))));
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_3)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  (void)pri_strength;
  (void)sec_strength;
  (void)dir;
  (void)pri_damping;
  (void)sec_damping;
  (void)coeff_shift;
  (void)block_width;

  if (block_width == 8) {
    copy_block_8xh(/*is_lowbd=*/1, dest, dstride, in, block_height);
  } else {
    copy_block_4xh(/*is_lowbd=*/1, dest, dstride, in, block_height);
  }
}